

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

lua_Integer lua_tointeger(lua_State *L,int idx)

{
  int iVar1;
  TValue *pTVar2;
  int in_ESI;
  lua_State *in_RDI;
  lua_Number n;
  TValue tmp;
  cTValue *o;
  TValue *in_stack_ffffffffffffffc8;
  GCstr *in_stack_ffffffffffffffd0;
  double local_28;
  
  pTVar2 = index2adr(in_RDI,in_ESI);
  if ((pTVar2->field_2).it < 0xfffeffff) {
    local_28 = pTVar2->n;
  }
  else if (((pTVar2->field_2).it != 0xfffffffb) ||
          (iVar1 = lj_strscan_num(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8), iVar1 == 0))
  {
    return 0;
  }
  return (long)local_28;
}

Assistant:

LUA_API lua_Integer lua_tointeger(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  lua_Number n;
  if (LJ_LIKELY(tvisint(o))) {
    return intV(o);
  } else if (LJ_LIKELY(tvisnum(o))) {
    n = numV(o);
  } else {
    if (!(tvisstr(o) && lj_strscan_number(strV(o), &tmp)))
      return 0;
    if (tvisint(&tmp))
      return intV(&tmp);
    n = numV(&tmp);
  }
#if LJ_64
  return (lua_Integer)n;
#else
  return lj_num2int(n);
#endif
}